

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O0

MPP_RET mpp_dec_set_cfg_by_cmd(MppDecCfgSet *set,MpiCmd cmd,void *param)

{
  RK_U32 local_68;
  RK_U32 local_64;
  RK_U32 local_60;
  RK_U32 local_5c;
  RK_U32 local_58;
  RK_U32 local_54;
  RK_U32 local_50;
  RK_U32 local_4c;
  MppFrameFormat local_48;
  RK_U32 local_44;
  RK_U32 local_40;
  RK_U32 local_3c;
  MPP_RET local_2c;
  MPP_RET ret;
  MppDecBaseCfg *cfg;
  void *param_local;
  MpiCmd cmd_local;
  MppDecCfgSet *set_local;
  
  local_2c = MPP_OK;
  switch(cmd) {
  case MPP_DEC_SET_PRESENT_TIME_ORDER:
    if (param == (void *)0x0) {
      local_3c = 1;
    }
    else {
      local_3c = *param;
    }
    (set->base).sort_pts = local_3c;
    (set->base).change = (set->base).change | 0x2000;
    if ((mpp_dec_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec","sort time order %d\n","mpp_dec_set_cfg_by_cmd",
                 (ulong)(set->base).sort_pts);
    }
    break;
  case MPP_DEC_SET_PARSER_SPLIT_MODE:
    if (param == (void *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = *param;
    }
    (set->base).split_parse = local_40;
    (set->base).change = (set->base).change | 0x800;
    if ((mpp_dec_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec","split parse mode %d\n","mpp_dec_set_cfg_by_cmd",
                 (ulong)(set->base).split_parse);
    }
    break;
  case MPP_DEC_SET_PARSER_FAST_MODE:
    if (param == (void *)0x0) {
      local_44 = 0;
    }
    else {
      local_44 = *param;
    }
    (set->base).fast_parse = local_44;
    (set->base).change = (set->base).change | 0x400;
    if ((mpp_dec_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec","fast parse mode %d\n","mpp_dec_set_cfg_by_cmd",
                 (ulong)(set->base).fast_parse);
    }
    break;
  default:
    _mpp_log_l(2,"mpp_dec","unsupported cfg update cmd %x\n","mpp_dec_set_cfg_by_cmd",(ulong)cmd);
    local_2c = MPP_NOK;
    break;
  case MPP_DEC_SET_OUTPUT_FORMAT:
    if (param == (void *)0x0) {
      local_48 = MPP_FMT_YUV420SP;
    }
    else {
      local_48 = *param;
    }
    (set->base).out_fmt = local_48;
    (set->base).change = (set->base).change | 0x100;
    break;
  case MPP_DEC_SET_DISABLE_ERROR:
    if (param == (void *)0x0) {
      local_4c = 1;
    }
    else {
      local_4c = *param;
    }
    (set->base).disable_error = local_4c;
    (set->base).change = (set->base).change | 0x4000;
    if ((mpp_dec_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec","disable error %d\n","mpp_dec_set_cfg_by_cmd",
                 (ulong)(set->base).disable_error);
    }
    break;
  case MPP_DEC_SET_IMMEDIATE_OUT:
    if (param == (void *)0x0) {
      local_54 = 0;
    }
    else {
      local_54 = *param;
    }
    (set->base).fast_out = local_54;
    (set->base).change = (set->base).change | 0x200;
    if ((mpp_dec_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec","fast output mode %d\n","mpp_dec_set_cfg_by_cmd",
                 (ulong)(set->base).fast_out);
    }
    break;
  case MPP_DEC_SET_ENABLE_DEINTERLACE:
    if (param == (void *)0x0) {
      local_58 = 1;
    }
    else {
      local_58 = *param;
    }
    (set->base).enable_vproc = local_58;
    (set->base).change = (set->base).change | 0x8000;
    if ((mpp_dec_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec","enable dec_vproc %x\n","mpp_dec_set_cfg_by_cmd",
                 (ulong)(set->base).enable_vproc);
    }
    break;
  case MPP_DEC_SET_ENABLE_FAST_PLAY:
    if (param == (void *)0x0) {
      local_5c = 0;
    }
    else {
      local_5c = *param;
    }
    (set->base).enable_fast_play = local_5c;
    (set->base).change = (set->base).change | 0x10000;
    if ((mpp_dec_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec","disable idr immediately output %d\n","mpp_dec_set_cfg_by_cmd",
                 (ulong)(set->base).enable_fast_play);
    }
    break;
  case MPP_DEC_SET_ENABLE_MVC:
    if (param == (void *)0x0) {
      local_60 = 0;
    }
    else {
      local_60 = *param;
    }
    (set->base).enable_mvc = local_60;
    (set->base).change = (set->base).change | 0x80000;
    if ((mpp_dec_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec","enable MVC decoder %d\n","mpp_dec_set_cfg_by_cmd",
                 (ulong)(set->base).enable_mvc);
    }
    break;
  case MPP_DEC_SET_DISABLE_DPB_CHECK:
    if (param == (void *)0x0) {
      local_64 = 0;
    }
    else {
      local_64 = *param;
    }
    (set->base).disable_dpb_chk = local_64;
    (set->base).change = (set->base).change | 0x100000;
    if ((mpp_dec_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec","disable dpb discontinuous check %d\n","mpp_dec_set_cfg_by_cmd",
                 (ulong)(set->base).disable_dpb_chk);
    }
    break;
  case MPP_DEC_SET_CODEC_MODE:
    if (param == (void *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = *param;
    }
    (set->base).codec_mode = local_68;
    (set->base).change = (set->base).change | 0x20000000;
    if ((mpp_dec_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec","force use codec device %d\n","mpp_dec_set_cfg_by_cmd",
                 (ulong)(set->base).codec_mode);
    }
    break;
  case MPP_DEC_SET_DIS_ERR_CLR_MARK:
    if (param == (void *)0x0) {
      local_50 = 1;
    }
    else {
      local_50 = *param;
    }
    (set->base).dis_err_clr_mark = local_50;
    (set->base).change = (set->base).change | 0x40000000;
    if ((mpp_dec_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec","disable error not mark%d\n","mpp_dec_set_cfg_by_cmd",
                 (ulong)(set->base).dis_err_clr_mark);
    }
  }
  return local_2c;
}

Assistant:

MPP_RET mpp_dec_set_cfg_by_cmd(MppDecCfgSet *set, MpiCmd cmd, void *param)
{
    MppDecBaseCfg *cfg = &set->base;
    MPP_RET ret = MPP_OK;

    switch (cmd) {
    case MPP_DEC_SET_PRESENT_TIME_ORDER : {
        cfg->sort_pts = (param) ? (*((RK_U32 *)param)) : (1);
        cfg->change |= MPP_DEC_CFG_CHANGE_SORT_PTS;
        dec_dbg_func("sort time order %d\n", cfg->sort_pts);
    } break;
    case MPP_DEC_SET_PARSER_SPLIT_MODE : {
        cfg->split_parse = (param) ? (*((RK_U32 *)param)) : (0);
        cfg->change |= MPP_DEC_CFG_CHANGE_SPLIT_PARSE;
        dec_dbg_func("split parse mode %d\n", cfg->split_parse);
    } break;
    case MPP_DEC_SET_PARSER_FAST_MODE : {
        cfg->fast_parse = (param) ? (*((RK_U32 *)param)) : (0);
        cfg->change |= MPP_DEC_CFG_CHANGE_FAST_PARSE;
        dec_dbg_func("fast parse mode %d\n", cfg->fast_parse);
    } break;
    case MPP_DEC_SET_OUTPUT_FORMAT : {
        cfg->out_fmt = (param) ? (*((MppFrameFormat *)param)) : (MPP_FMT_YUV420SP);
        cfg->change |= MPP_DEC_CFG_CHANGE_OUTPUT_FORMAT;
    } break;
    case MPP_DEC_SET_DISABLE_ERROR: {
        cfg->disable_error = (param) ? (*((RK_U32 *)param)) : (1);
        cfg->change |= MPP_DEC_CFG_CHANGE_DISABLE_ERROR;
        dec_dbg_func("disable error %d\n", cfg->disable_error);
    } break;
    case MPP_DEC_SET_DIS_ERR_CLR_MARK: {
        cfg->dis_err_clr_mark = (param) ? (*((RK_U32 *)param)) : (1);
        cfg->change |= MPP_DEC_CFG_CHANGE_DIS_ERR_CLR_MARK;
        dec_dbg_func("disable error not mark%d\n", cfg->dis_err_clr_mark);
    } break;
    case MPP_DEC_SET_IMMEDIATE_OUT : {
        cfg->fast_out = (param) ? (*((RK_U32 *)param)) : (0);
        cfg->change |= MPP_DEC_CFG_CHANGE_FAST_OUT;
        dec_dbg_func("fast output mode %d\n", cfg->fast_out);
    } break;
    case MPP_DEC_SET_ENABLE_DEINTERLACE: {
        cfg->enable_vproc = (param) ? (*((RK_U32 *)param)) : MPP_VPROC_MODE_DEINTELACE;
        cfg->change |= MPP_DEC_CFG_CHANGE_ENABLE_VPROC;
        dec_dbg_func("enable dec_vproc %x\n", cfg->enable_vproc);
    } break;
    case MPP_DEC_SET_ENABLE_FAST_PLAY : {
        cfg->enable_fast_play = (param) ? (*((RK_U32 *)param)) : (0);
        cfg->change |= MPP_DEC_CFG_CHANGE_ENABLE_FAST_PLAY;
        dec_dbg_func("disable idr immediately output %d\n", cfg->enable_fast_play);
    } break;
    case MPP_DEC_SET_ENABLE_MVC : {
        cfg->enable_mvc = (param) ? (*((RK_U32 *)param)) : (0);
        cfg->change |= MPP_DEC_CFG_CHANGE_ENABLE_MVC;
        dec_dbg_func("enable MVC decoder %d\n", cfg->enable_mvc);
    } break;
    case MPP_DEC_SET_DISABLE_DPB_CHECK : {
        cfg->disable_dpb_chk = (param) ? (*((RK_U32 *)param)) : (0);
        cfg->change |= MPP_DEC_CFG_CHANGE_DISABLE_DPB_CHECK;
        dec_dbg_func("disable dpb discontinuous check %d\n", cfg->disable_dpb_chk);
    } break;
    case MPP_DEC_SET_CODEC_MODE : {
        cfg->codec_mode = (param) ? (*((RK_U32 *)param)) : (0);
        cfg->change |= MPP_DEC_CFG_CHANGE_CODEC_MODE;
        dec_dbg_func("force use codec device %d\n", cfg->codec_mode);
    } break;
    default : {
        mpp_err_f("unsupported cfg update cmd %x\n", cmd);
        ret = MPP_NOK;
    } break;
    }

    return ret;
}